

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O2

void __thiscall BrightnessControl::force_adjust(BrightnessControl *this)

{
  pointer piVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  long lVar4;
  float __x;
  
  piVar1 = (this->thresh).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->thresh).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __x = SensorALS::get_value(this->als);
  roundf(__x);
  _Var3 = std::
          __upper_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Val_less_iter>
                    (piVar1,piVar2);
  lVar4 = (long)_Var3._M_current -
          (long)(this->thresh).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->cur = lVar4 >> 2;
  brightness_slide(this,*(int *)((long)(this->value).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar4));
  return;
}

Assistant:

void BrightnessControl::force_adjust()
{
	cur=std::upper_bound(thresh.begin(),thresh.end(),(int)roundf(als->get_value()))
		-thresh.begin();
	brightness_slide(value[cur]);
}